

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdisplay.c
# Opt level: O0

void xdpy_flip_display(ALLEGRO_DISPLAY *d)

{
  _Bool _Var1;
  GLenum e_00;
  ALLEGRO_SYSTEM *pAVar2;
  char *pcVar3;
  long in_RDI;
  int e;
  ALLEGRO_DISPLAY_XGLX *glx;
  ALLEGRO_SYSTEM_XGLX *system;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  
  pAVar2 = al_get_system_driver();
  e_00 = glGetError();
  if ((e_00 != 0) &&
     (_Var1 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,d._4_4_,
                               (char *)system), _Var1)) {
    pcVar3 = _al_gl_error_string(e_00);
    _al_trace_suffix("OpenGL error was not 0: %s\n",pcVar3);
  }
  if (*(int *)(in_RDI + 0x118) == 0) {
    glXSwapBuffers(pAVar2[1].displays._itemsize,*(undefined8 *)(in_RDI + 0x290));
  }
  else {
    glFlush();
  }
  return;
}

Assistant:

static void xdpy_flip_display(ALLEGRO_DISPLAY *d)
{
   ALLEGRO_SYSTEM_XGLX *system = (ALLEGRO_SYSTEM_XGLX *)al_get_system_driver();
   ALLEGRO_DISPLAY_XGLX *glx = (ALLEGRO_DISPLAY_XGLX *)d;

   int e = glGetError();
   if (e) {
      ALLEGRO_ERROR("OpenGL error was not 0: %s\n", _al_gl_error_string(e));
   }

   if (d->extra_settings.settings[ALLEGRO_SINGLE_BUFFER])
      glFlush();
   else
      glXSwapBuffers(system->gfxdisplay, glx->glxwindow);
}